

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::legacy_tex_op
          (string *__return_storage_ptr__,CompilerGLSL *this,string *op,SPIRType *imgtype,
          uint32_t lod,uint32_t tex)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  SPIRType *pSVar6;
  runtime_error *prVar7;
  SPIRType *ts_1;
  char *pcVar8;
  string *psVar9;
  char *pcVar10;
  undefined4 in_register_00000084;
  char *type;
  string type_prefix;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  char local_60 [16];
  string local_50;
  
  switch((imgtype->image).dim) {
  case Dim1D:
    pcVar8 = "iimage1D";
    pcVar10 = "iimage1DArray";
    goto LAB_001c8159;
  case Dim2D:
    pcVar8 = "iimage2D";
    pcVar10 = "iimage2DArray";
LAB_001c8159:
    pSVar6 = (SPIRType *)(pcVar8 + 6);
    ts_1 = (SPIRType *)(pcVar10 + 6);
    if (((this->options).es & 1U) != 0) {
      ts_1 = pSVar6;
    }
    local_80._0_8_ = ts_1;
    if ((imgtype->image).arrayed == false) {
      ts_1 = pSVar6;
      local_80._0_8_ = pSVar6;
    }
    break;
  case Dim3D:
    ts_1 = (SPIRType *)&switchD_001c8115::switchdataD_002d844c;
    local_80._0_8_ = (SPIRType *)0x2db5b4;
    break;
  case DimCube:
    ts_1 = (SPIRType *)&switchD_001c8115::switchdataD_002d844c;
    local_80._0_8_ = (SPIRType *)0x2db5ca;
    break;
  case DimRect:
    ts_1 = (SPIRType *)&switchD_001c8115::switchdataD_002d844c;
    local_80._0_8_ = (SPIRType *)0x2db5a7;
    break;
  case DimBuffer:
    ts_1 = (SPIRType *)&switchD_001c8115::switchdataD_002d844c;
    local_80._0_8_ = (SPIRType *)0x2db5bd;
    break;
  case DimSubpassData:
    ts_1 = (SPIRType *)&switchD_001c8115::switchdataD_002d844c;
    local_80._0_8_ = (SPIRType *)0x2db575;
    break;
  default:
    ts_1 = imgtype;
    local_80._0_8_ = (SPIRType *)0x2d80a2;
  }
  local_80._8_8_ = __return_storage_ptr__;
  bVar2 = check_explicit_lod_allowed(this,lod);
  iVar5 = ::std::__cxx11::string::compare((char *)op);
  if ((((iVar5 == 0) || (iVar5 = ::std::__cxx11::string::compare((char *)op), iVar5 == 0)) ||
      (iVar5 = ::std::__cxx11::string::compare((char *)op), iVar5 == 0)) ||
     (iVar5 = ::std::__cxx11::string::compare((char *)op), iVar5 == 0)) {
    bVar3 = (this->options).es;
    uVar1 = (this->options).version;
    ts_1 = (SPIRType *)(ulong)uVar1;
    if ((uVar1 < 300 & bVar3) == 1) {
      if (bVar2) {
        local_70._M_allocated_capacity = (size_type)local_60;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_80 + 0x10),"GL_EXT_shader_texture_lod","");
        require_extension_internal(this,(string *)(local_80 + 0x10));
LAB_001c8278:
        if ((char *)local_70._M_allocated_capacity != local_60) {
          operator_delete((void *)local_70._M_allocated_capacity);
        }
      }
    }
    else {
      ts_1 = (SPIRType *)(ulong)CONCAT31((int3)(uVar1 >> 8),0x81 < uVar1);
      if (bVar3 == false && 0x81 >= uVar1) {
        local_70._M_allocated_capacity = (size_type)local_60;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_80 + 0x10),"GL_ARB_shader_texture_lod","");
        require_extension_internal(this,(string *)(local_80 + 0x10));
        goto LAB_001c8278;
      }
    }
  }
  iVar5 = ::std::__cxx11::string::compare((char *)op);
  if ((iVar5 == 0) || (iVar5 = ::std::__cxx11::string::compare((char *)op), iVar5 == 0)) {
    if (((this->options).es == true) && ((this->options).version < 300)) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[26]>
                ((string *)(local_80 + 0x10),(spirv_cross *)op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " not allowed in legacy ES",(char (*) [26])ts_1);
      ::std::runtime_error::runtime_error(prVar7,(string *)(local_80 + 0x10));
      *(undefined ***)prVar7 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_70._M_allocated_capacity = (size_type)local_60;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_80 + 0x10),"GL_EXT_gpu_shader4","");
    require_extension_internal(this,(string *)(local_80 + 0x10));
    if ((char *)local_70._M_allocated_capacity != local_60) {
      operator_delete((void *)local_70._M_allocated_capacity);
    }
  }
  bVar3 = Compiler::image_is_comparison(&this->super_Compiler,imgtype,tex);
  if (((bVar3) && ((this->options).es == true)) && ((this->options).version < 300)) {
    iVar5 = ::std::__cxx11::string::compare((char *)op);
    if ((iVar5 != 0) && (iVar5 = ::std::__cxx11::string::compare((char *)op), iVar5 != 0)) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      join<std::__cxx11::string_const&,char_const(&)[44]>
                ((string *)(local_80 + 0x10),(spirv_cross *)op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " not allowed on depth samplers in legacy ES",(char (*) [44])ts_1);
      ::std::runtime_error::runtime_error(prVar7,(string *)(local_80 + 0x10));
      *(undefined ***)prVar7 = &PTR__runtime_error_00357118;
      __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_70._M_allocated_capacity = (size_type)local_60;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_80 + 0x10),"GL_EXT_shadow_samplers","");
    require_extension_internal(this,(string *)(local_80 + 0x10));
    if ((char *)local_70._M_allocated_capacity != local_60) {
      operator_delete((void *)local_70._M_allocated_capacity);
    }
  }
  bVar3 = false;
  if (((this->options).es == true) && (bVar3 = false, (this->options).version < 300)) {
    bVar3 = Compiler::image_is_comparison(&this->super_Compiler,imgtype,tex);
  }
  bVar4 = Compiler::image_is_comparison(&this->super_Compiler,imgtype,tex);
  pcVar8 = "shadow";
  pcVar10 = "texture";
  if (bVar4) {
    pcVar10 = "shadow";
  }
  local_70._M_allocated_capacity = (size_type)local_60;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_80 + 0x10),pcVar10,pcVar10 + ((ulong)bVar4 ^ 7));
  iVar5 = ::std::__cxx11::string::compare((char *)op);
  psVar9 = (string *)local_80._8_8_;
  if (iVar5 == 0) {
    if (bVar3 != false) {
      join<std::__cxx11::string&,char_const*&,char_const(&)[4]>
                ((string *)local_80._8_8_,(spirv_cross *)(local_80 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 (char **)0x2dd10c,(char (*) [4])CONCAT44(in_register_00000084,lod));
      goto LAB_001c8691;
    }
  }
  else {
    iVar5 = ::std::__cxx11::string::compare((char *)op);
    psVar9 = (string *)local_80._8_8_;
    if (iVar5 == 0) {
      if (bVar2) {
        local_50._M_dataplus._M_p = "LodEXT";
        if (299 < (this->options).version) {
          local_50._M_dataplus._M_p = "Lod";
        }
        if ((this->options).es == false) {
          local_50._M_dataplus._M_p = "Lod";
        }
        join<std::__cxx11::string&,char_const*&,char_const*>
                  ((string *)local_80._8_8_,(spirv_cross *)(local_80 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   (char **)&local_50,(char **)CONCAT44(in_register_00000084,lod));
        goto LAB_001c8691;
      }
    }
    else {
      iVar5 = ::std::__cxx11::string::compare((char *)op);
      psVar9 = (string *)local_80._8_8_;
      if (iVar5 == 0) {
        local_50._M_dataplus._M_p = "Proj";
        if (bVar3 != false) {
          local_50._M_dataplus._M_p = "ProjEXT";
        }
        join<std::__cxx11::string&,char_const*&,char_const*>
                  ((string *)local_80._8_8_,(spirv_cross *)(local_80 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   (char **)&local_50,(char **)CONCAT44(in_register_00000084,lod));
        goto LAB_001c8691;
      }
      iVar5 = ::std::__cxx11::string::compare((char *)op);
      psVar9 = (string *)local_80._8_8_;
      if (iVar5 == 0) {
        uVar1 = (this->options).version;
        pcVar8 = "GradARB";
        if (0x81 < uVar1) {
          pcVar8 = "Grad";
        }
        bVar2 = (this->options).es;
        if (bVar2 != false) {
          pcVar8 = "Grad";
        }
        local_50._M_dataplus._M_p = "GradEXT";
        if (299 < uVar1) {
          local_50._M_dataplus._M_p = pcVar8;
        }
        if (bVar2 == false) {
          local_50._M_dataplus._M_p = pcVar8;
        }
        join<std::__cxx11::string&,char_const*&,char_const*>
                  ((string *)local_80._8_8_,(spirv_cross *)(local_80 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   (char **)&local_50,(char **)CONCAT44(in_register_00000084,lod));
        goto LAB_001c8691;
      }
      iVar5 = ::std::__cxx11::string::compare((char *)op);
      psVar9 = (string *)local_80._8_8_;
      if (iVar5 == 0) {
        if (bVar2) {
          local_50._M_dataplus._M_p = "ProjLodEXT";
          if (299 < (this->options).version) {
            local_50._M_dataplus._M_p = "ProjLod";
          }
          if ((this->options).es == false) {
            local_50._M_dataplus._M_p = "ProjLod";
          }
          join<std::__cxx11::string&,char_const*&,char_const*>
                    ((string *)local_80._8_8_,(spirv_cross *)(local_80 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     (char **)&local_50,(char **)CONCAT44(in_register_00000084,lod));
        }
        else {
          join<std::__cxx11::string&,char_const*&,char_const(&)[5]>
                    ((string *)local_80._8_8_,(spirv_cross *)(local_80 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     (char **)0x2db2d1,(char (*) [5])CONCAT44(in_register_00000084,lod));
        }
        goto LAB_001c8691;
      }
      iVar5 = ::std::__cxx11::string::compare((char *)op);
      psVar9 = (string *)local_80._8_8_;
      if (iVar5 != 0) {
        iVar5 = ::std::__cxx11::string::compare((char *)op);
        psVar9 = (string *)local_80._8_8_;
        if (iVar5 == 0) {
          uVar1 = (this->options).version;
          pcVar8 = "ProjGradARB";
          if (0x81 < uVar1) {
            pcVar8 = "ProjGrad";
          }
          bVar2 = (this->options).es;
          if (bVar2 != false) {
            pcVar8 = "ProjGrad";
          }
          local_50._M_dataplus._M_p = "ProjGradEXT";
          if (299 < uVar1) {
            local_50._M_dataplus._M_p = pcVar8;
          }
          if (bVar2 == false) {
            local_50._M_dataplus._M_p = pcVar8;
          }
          join<std::__cxx11::string&,char_const*&,char_const*>
                    ((string *)local_80._8_8_,(spirv_cross *)(local_80 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     (char **)&local_50,(char **)CONCAT44(in_register_00000084,lod));
        }
        else {
          iVar5 = ::std::__cxx11::string::compare((char *)op);
          psVar9 = (string *)local_80._8_8_;
          if (iVar5 != 0) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            join<char_const(&)[32],std::__cxx11::string_const&>
                      (&local_50,(spirv_cross *)"Unsupported legacy texture op: ",(char (*) [32])op,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar8);
            ::std::runtime_error::runtime_error(prVar7,(string *)&local_50);
            *(undefined ***)prVar7 = &PTR__runtime_error_00357118;
            __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (bVar2) {
            join<std::__cxx11::string&,char_const*&,char_const(&)[14]>
                      ((string *)local_80._8_8_,(spirv_cross *)(local_80 + 0x10),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,(char **)0x2db312,(char (*) [14])CONCAT44(in_register_00000084,lod));
          }
          else {
            join<std::__cxx11::string&,char_const*&,char_const(&)[11]>
                      ((string *)local_80._8_8_,(spirv_cross *)(local_80 + 0x10),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,(char **)0x2db327,(char (*) [11])CONCAT44(in_register_00000084,lod));
          }
        }
        goto LAB_001c8691;
      }
      if (bVar2) {
        join<std::__cxx11::string&,char_const*&,char_const(&)[10]>
                  ((string *)local_80._8_8_,(spirv_cross *)(local_80 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   (char **)0x2db2b2,(char (*) [10])CONCAT44(in_register_00000084,lod));
        goto LAB_001c8691;
      }
    }
  }
  psVar9 = (string *)local_80._8_8_;
  join<std::__cxx11::string&,char_const*&>
            ((string *)local_80._8_8_,(spirv_cross *)(local_80 + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
             (char **)pcVar8);
LAB_001c8691:
  if ((char *)local_70._M_allocated_capacity != local_60) {
    operator_delete((void *)local_70._M_allocated_capacity);
  }
  return psVar9;
}

Assistant:

string CompilerGLSL::legacy_tex_op(const std::string &op, const SPIRType &imgtype, uint32_t lod, uint32_t tex)
{
	const char *type;
	switch (imgtype.image.dim)
	{
	case spv::Dim1D:
		type = (imgtype.image.arrayed && !options.es) ? "1DArray" : "1D";
		break;
	case spv::Dim2D:
		type = (imgtype.image.arrayed && !options.es) ? "2DArray" : "2D";
		break;
	case spv::Dim3D:
		type = "3D";
		break;
	case spv::DimCube:
		type = "Cube";
		break;
	case spv::DimRect:
		type = "2DRect";
		break;
	case spv::DimBuffer:
		type = "Buffer";
		break;
	case spv::DimSubpassData:
		type = "2D";
		break;
	default:
		type = "";
		break;
	}

	bool use_explicit_lod = check_explicit_lod_allowed(lod);

	if (op == "textureLod" || op == "textureProjLod" || op == "textureGrad" || op == "textureProjGrad")
	{
		if (is_legacy_es())
		{
			if (use_explicit_lod)
				require_extension_internal("GL_EXT_shader_texture_lod");
		}
		else if (is_legacy())
			require_extension_internal("GL_ARB_shader_texture_lod");
	}

	if (op == "textureLodOffset" || op == "textureProjLodOffset")
	{
		if (is_legacy_es())
			SPIRV_CROSS_THROW(join(op, " not allowed in legacy ES"));

		require_extension_internal("GL_EXT_gpu_shader4");
	}

	// GLES has very limited support for shadow samplers.
	// Basically shadow2D and shadow2DProj work through EXT_shadow_samplers,
	// everything else can just throw
	if (image_is_comparison(imgtype, tex) && is_legacy_es())
	{
		if (op == "texture" || op == "textureProj")
			require_extension_internal("GL_EXT_shadow_samplers");
		else
			SPIRV_CROSS_THROW(join(op, " not allowed on depth samplers in legacy ES"));
	}

	bool is_es_and_depth = is_legacy_es() && image_is_comparison(imgtype, tex);
	std::string type_prefix = image_is_comparison(imgtype, tex) ? "shadow" : "texture";

	if (op == "texture")
		return is_es_and_depth ? join(type_prefix, type, "EXT") : join(type_prefix, type);
	else if (op == "textureLod")
	{
		if (use_explicit_lod)
			return join(type_prefix, type, is_legacy_es() ? "LodEXT" : "Lod");
		else
			return join(type_prefix, type);
	}
	else if (op == "textureProj")
		return join(type_prefix, type, is_es_and_depth ? "ProjEXT" : "Proj");
	else if (op == "textureGrad")
		return join(type_prefix, type, is_legacy_es() ? "GradEXT" : is_legacy_desktop() ? "GradARB" : "Grad");
	else if (op == "textureProjLod")
	{
		if (use_explicit_lod)
			return join(type_prefix, type, is_legacy_es() ? "ProjLodEXT" : "ProjLod");
		else
			return join(type_prefix, type, "Proj");
	}
	else if (op == "textureLodOffset")
	{
		if (use_explicit_lod)
			return join(type_prefix, type, "LodOffset");
		else
			return join(type_prefix, type);
	}
	else if (op == "textureProjGrad")
		return join(type_prefix, type,
		            is_legacy_es() ? "ProjGradEXT" : is_legacy_desktop() ? "ProjGradARB" : "ProjGrad");
	else if (op == "textureProjLodOffset")
	{
		if (use_explicit_lod)
			return join(type_prefix, type, "ProjLodOffset");
		else
			return join(type_prefix, type, "ProjOffset");
	}
	else
	{
		SPIRV_CROSS_THROW(join("Unsupported legacy texture op: ", op));
	}
}